

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

WhereBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_wherebroadcastable(NeuralNetworkLayer *this)

{
  WhereBroadcastableLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x532) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x532;
    this_00 = (WhereBroadcastableLayerParams *)operator_new(0x18);
    WhereBroadcastableLayerParams::WhereBroadcastableLayerParams(this_00);
    (this->layer_).wherebroadcastable_ = this_00;
  }
  return (WhereBroadcastableLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::WhereBroadcastableLayerParams* NeuralNetworkLayer::mutable_wherebroadcastable() {
  if (!has_wherebroadcastable()) {
    clear_layer();
    set_has_wherebroadcastable();
    layer_.wherebroadcastable_ = new ::CoreML::Specification::WhereBroadcastableLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.whereBroadcastable)
  return layer_.wherebroadcastable_;
}